

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

AstNode * raviX_cast_to_integer(CompilerState *compiler_state,AstNode *subexpr)

{
  AstNode *pAVar1;
  AstNode *expr;
  AstNode *subexpr_local;
  CompilerState *compiler_state_local;
  
  pAVar1 = raviX_allocate_ast_node_at_line(compiler_state,EXPR_UNARY,subexpr->line_number);
  (pAVar1->field_2).function_stmt.function_expr = subexpr;
  (pAVar1->field_2).unary_expr.unary_op = UNOPR_TO_INTEGER;
  (subexpr->field_2).embedded_C_stmt.is_decl =
       (_Bool)((subexpr->field_2).embedded_C_stmt.is_decl & 0xfeU | 1);
  set_typecode((VariableType *)&(pAVar1->field_2).return_stmt,RAVI_TNUMINT);
  return pAVar1;
}

Assistant:

AstNode *raviX_cast_to_integer(CompilerState *compiler_state, AstNode *subexpr) {
	AstNode *expr = raviX_allocate_ast_node_at_line(compiler_state, EXPR_UNARY, subexpr->line_number);
	expr->unary_expr.expr = subexpr;
	expr->unary_expr.unary_op = UNOPR_TO_INTEGER;
	subexpr->common_expr.truncate_results = 1;
	set_typecode(&expr->common_expr.type, RAVI_TNUMINT);
	return expr;
}